

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_advanced.hpp
# Opt level: O0

void __thiscall
LDPC4QKD::
FixedSizeEncoderQC<unsigned_char,1024ul,2048ul,512ul,7680ul,unsigned_short,unsigned_short,unsigned_short>
::encode_qc<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
          (FixedSizeEncoderQC<unsigned_char,1024ul,2048ul,512ul,7680ul,unsigned_short,unsigned_short,unsigned_short>
           *this,vector<bool,_std::allocator<bool>_> *in,vector<bool,_std::allocator<bool>_> *out)

{
  unsigned_long uVar1;
  const_reference cVar2;
  bool __x;
  size_type sVar3;
  ostream *poVar4;
  out_of_range *this_00;
  const_reference pvVar5;
  const_reference pvVar6;
  undefined1 rhs;
  ulong uVar7;
  _Bit_reference lhs;
  reference local_228;
  reference local_218;
  size_type local_208;
  unsigned_long outIdx;
  value_type_conflict2 QCrow;
  ulong uStack_1f8;
  value_type_conflict2 shiftVal;
  size_t j;
  unsigned_long QCcol;
  size_t col;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  vector<bool,_std::allocator<bool>_> *local_20;
  vector<bool,_std::allocator<bool>_> *out_local;
  vector<bool,_std::allocator<bool>_> *in_local;
  FixedSizeEncoderQC<unsigned_char,_1024UL,_2048UL,_512UL,_7680UL,_unsigned_short,_unsigned_short,_unsigned_short>
  *this_local;
  
  local_20 = out;
  out_local = in;
  in_local = (vector<bool,_std::allocator<bool>_> *)this;
  sVar3 = std::size<std::vector<bool,std::allocator<bool>>>(in);
  if (sVar3 == 0x100000) {
    sVar3 = std::size<std::vector<bool,std::allocator<bool>>>(local_20);
    if (sVar3 == 0x80000) {
      QCcol = 0;
      while( true ) {
        uVar1 = QCcol;
        sVar3 = std::vector<bool,_std::allocator<bool>_>::size(out_local);
        if (sVar3 <= uVar1) break;
        j = QCcol >> 9;
        pvVar5 = std::array<unsigned_short,_2049UL>::operator[]
                           ((array<unsigned_short,_2049UL> *)(this + 8),j);
        uStack_1f8 = (ulong)*pvVar5;
        while( true ) {
          uVar7 = uStack_1f8;
          pvVar5 = std::array<unsigned_short,_2049UL>::operator[]
                             ((array<unsigned_short,_2049UL> *)(this + 8),j + 1);
          if (*pvVar5 <= uVar7) break;
          pvVar6 = std::array<unsigned_short,_7680UL>::operator[]
                             ((array<unsigned_short,_7680UL> *)(this + 0x4c0a),uStack_1f8);
          outIdx._6_2_ = *pvVar6;
          pvVar6 = std::array<unsigned_short,_7680UL>::operator[]
                             ((array<unsigned_short,_7680UL> *)(this + 0x100a),uStack_1f8);
          outIdx._4_2_ = *pvVar6;
          uVar7 = QCcol - outIdx._6_2_ & 0x1ff;
          local_208 = (ulong)outIdx._4_2_ * 0x200 + uVar7;
          local_218 = std::vector<bool,_std::allocator<bool>_>::operator[](local_20,local_208);
          rhs = (undefined1)uVar7;
          cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](out_local,QCcol);
          lhs._M_mask._0_1_ = cVar2;
          lhs._M_p = (_Bit_type *)local_218._M_mask;
          lhs._M_mask._1_7_ = 0;
          __x = xor_as_bools<std::_Bit_reference,bool>((LDPC4QKD *)local_218._M_p,lhs,(bool)rhs);
          local_228 = std::vector<bool,_std::allocator<bool>_>::operator[](local_20,local_208);
          std::_Bit_reference::operator=(&local_228,__x);
          uStack_1f8 = uStack_1f8 + 1;
        }
        QCcol = QCcol + 1;
      }
      return;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar4 = std::operator<<(local_198,"LDPC encoder: incorrect sizes of intput / output arrays\n");
  poVar4 = std::operator<<(poVar4,"RECEIVED: key.size() = ");
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size(out_local);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
  poVar4 = std::operator<<(poVar4,". ");
  poVar4 = std::operator<<(poVar4,"syndrome.size() = ");
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size(local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
  poVar4 = std::operator<<(poVar4,".\n");
  poVar4 = std::operator<<(poVar4,"EXPECTED: key.size() = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x100000);
  poVar4 = std::operator<<(poVar4,". ");
  poVar4 = std::operator<<(poVar4,"syndrome.size() = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x80000);
  std::operator<<(poVar4,".\n");
  col._7_1_ = 1;
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::out_of_range::out_of_range(this_00,local_1d8);
  col._7_1_ = 0;
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void encode_qc(auto const &in, auto &out) const {
            if (std::size(in) != N * expansion_factor || std::size(out) != M * expansion_factor) {
                std::stringstream s;
                s << "LDPC encoder: incorrect sizes of intput / output arrays\n"
                  << "RECEIVED: key.size() = " << in.size() << ". " << "syndrome.size() = " << out.size() << ".\n"
                  << "EXPECTED: key.size() = " << N * expansion_factor << ". "
                  << "syndrome.size() = " << M * expansion_factor << ".\n";
                throw std::out_of_range(s.str());
            }

            for (std::size_t col = 0; col < in.size(); col++) {
                auto QCcol = col / expansion_factor;  // column index into matrix of exponents
                for (std::size_t j = colptr[QCcol]; j < colptr[QCcol + 1]; j++) {
                    auto shiftVal = values[j];
                    auto QCrow = row_idx[j];  // row index into matrix of exponents
                    // computes `outIdx`, which is the unique row index (into full matrix) at which there is a `1`
                    // arising from the current sub-block.
                    // The sub-block is determined by the QC-exponent `shiftVal`.
                    // Add the base row-index of the current sub-block to the shift
                    auto outIdx = (expansion_factor * QCrow) + ((col - shiftVal) % expansion_factor);

                    out[outIdx] = xor_as_bools(out[outIdx], in[col]);
                }
            }
        }